

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler,uint desc_set)

{
  spvc_context this;
  spvc_result sVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    spirv_cross::CompilerMSL::add_discrete_descriptor_set
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,desc_set);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"MSL function used on a non-MSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_add_discrete_descriptor_set(spvc_compiler compiler, unsigned desc_set)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	msl.add_discrete_descriptor_set(desc_set);
	return SPVC_SUCCESS;
#else
	(void)desc_set;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}